

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_vertex_element
               (void *dst,float *values,int value_count,nk_draw_vertex_layout_format format)

{
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  double local_48;
  double value_6;
  nk_uint value_5;
  nk_ushort value_4;
  uchar value_3;
  nk_int value_2;
  nk_short value_1;
  char value;
  void *attribute;
  nk_draw_vertex_layout_format local_20;
  int value_index;
  nk_draw_vertex_layout_format format_local;
  int value_count_local;
  float *values_local;
  void *dst_local;
  
  _value_2 = dst;
  local_20 = format;
  value_index = value_count;
  _format_local = values;
  values_local = (float *)dst;
  if (format < NK_FORMAT_COLOR_BEGIN) {
    if ((format < NK_FORMAT_COLOR_BEGIN) || (NK_FORMAT_COLOR_END < format)) {
      for (attribute._4_4_ = 0; attribute._4_4_ < value_index; attribute._4_4_ = attribute._4_4_ + 1
          ) {
        switch(local_20) {
        case NK_FORMAT_SCHAR:
          if (127.0 < _format_local[attribute._4_4_] || _format_local[attribute._4_4_] == 127.0) {
            local_54 = 127.0;
          }
          else {
            local_54 = _format_local[attribute._4_4_];
          }
          if (-127.0 <= local_54) {
            if (127.0 < _format_local[attribute._4_4_] || _format_local[attribute._4_4_] == 127.0) {
              local_5c = 127.0;
            }
            else {
              local_5c = _format_local[attribute._4_4_];
            }
            local_58 = local_5c;
          }
          else {
            local_58 = -127.0;
          }
          value_3 = (uchar)(int)local_58;
          nk_memcopy(_value_2,&value_3,1);
          _value_2 = (void *)((long)_value_2 + 1);
          break;
        case NK_FORMAT_SSHORT:
          if (32767.0 < _format_local[attribute._4_4_] || _format_local[attribute._4_4_] == 32767.0)
          {
            local_60 = 32767.0;
          }
          else {
            local_60 = _format_local[attribute._4_4_];
          }
          if (-32767.0 <= local_60) {
            if (32767.0 < _format_local[attribute._4_4_] ||
                _format_local[attribute._4_4_] == 32767.0) {
              local_68 = 32767.0;
            }
            else {
              local_68 = _format_local[attribute._4_4_];
            }
            local_64 = local_68;
          }
          else {
            local_64 = -32767.0;
          }
          value_4 = (nk_ushort)(int)local_64;
          nk_memcopy(_value_2,&value_4,2);
          _value_2 = (void *)((long)_value_2 + 2);
          break;
        case NK_FORMAT_SINT:
          if (2.1474836e+09 < _format_local[attribute._4_4_] ||
              _format_local[attribute._4_4_] == 2.1474836e+09) {
            local_6c = 2.1474836e+09;
          }
          else {
            local_6c = _format_local[attribute._4_4_];
          }
          if (-2.1474836e+09 <= local_6c) {
            if (2.1474836e+09 < _format_local[attribute._4_4_] ||
                _format_local[attribute._4_4_] == 2.1474836e+09) {
              local_74 = 2.1474836e+09;
            }
            else {
              local_74 = _format_local[attribute._4_4_];
            }
            local_70 = local_74;
          }
          else {
            local_70 = -2.1474836e+09;
          }
          value_5 = (nk_uint)local_70;
          nk_memcopy(_value_2,&value_5,4);
          _value_2 = (void *)((long)_value_2 + 4);
          break;
        case NK_FORMAT_UCHAR:
          if (256.0 < _format_local[attribute._4_4_] || _format_local[attribute._4_4_] == 256.0) {
            local_78 = 256.0;
          }
          else {
            local_78 = _format_local[attribute._4_4_];
          }
          if (0.0 <= local_78) {
            if (256.0 < _format_local[attribute._4_4_] || _format_local[attribute._4_4_] == 256.0) {
              local_80 = 256.0;
            }
            else {
              local_80 = _format_local[attribute._4_4_];
            }
            local_7c = local_80;
          }
          else {
            local_7c = 0.0;
          }
          value_6._7_1_ = (undefined1)(int)local_7c;
          nk_memcopy(_value_2,(void *)((long)&value_6 + 7),1);
          _value_2 = (void *)((long)_value_2 + 1);
          break;
        case NK_FORMAT_USHORT:
          if (65535.0 < _format_local[attribute._4_4_] || _format_local[attribute._4_4_] == 65535.0)
          {
            local_84 = 65535.0;
          }
          else {
            local_84 = _format_local[attribute._4_4_];
          }
          if (0.0 <= local_84) {
            if (65535.0 < _format_local[attribute._4_4_] ||
                _format_local[attribute._4_4_] == 65535.0) {
              local_8c = 65535.0;
            }
            else {
              local_8c = _format_local[attribute._4_4_];
            }
            local_88 = local_8c;
          }
          else {
            local_88 = 0.0;
          }
          value_6._4_2_ = (undefined2)(int)local_88;
          nk_memcopy(_value_2,(void *)((long)&value_6 + 4),2);
          _value_2 = (void *)((long)_value_2 + 2);
          break;
        case NK_FORMAT_UINT:
          if (4.2949673e+09 < _format_local[attribute._4_4_] ||
              _format_local[attribute._4_4_] == 4.2949673e+09) {
            local_90 = 4.2949673e+09;
          }
          else {
            local_90 = _format_local[attribute._4_4_];
          }
          if (0.0 <= local_90) {
            if (4.2949673e+09 < _format_local[attribute._4_4_] ||
                _format_local[attribute._4_4_] == 4.2949673e+09) {
              local_98 = 4.2949673e+09;
            }
            else {
              local_98 = _format_local[attribute._4_4_];
            }
            local_94 = local_98;
          }
          else {
            local_94 = 0.0;
          }
          value_6._0_4_ = (undefined4)(long)local_94;
          nk_memcopy(_value_2,&value_6,4);
          _value_2 = (void *)((long)_value_2 + 4);
          break;
        case NK_FORMAT_FLOAT:
          nk_memcopy(_value_2,_format_local + attribute._4_4_,4);
          _value_2 = (void *)((long)_value_2 + 4);
          break;
        case NK_FORMAT_DOUBLE:
          local_48 = (double)_format_local[attribute._4_4_];
          nk_memcopy(_value_2,&local_48,8);
          _value_2 = (void *)((long)_value_2 + 8);
          break;
        default:
          __assert_fail("0 && \"invalid vertex layout format\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                        ,0x1ac8,
                        "void nk_draw_vertex_element(void *, const float *, int, enum nk_draw_vertex_layout_format)"
                       );
        }
      }
    }
    return;
  }
  __assert_fail("format < NK_FORMAT_COLOR_BEGIN",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                ,0x1ac4,
                "void nk_draw_vertex_element(void *, const float *, int, enum nk_draw_vertex_layout_format)"
               );
}

Assistant:

static void
nk_draw_vertex_element(void *dst, const float *values, int value_count,
    enum nk_draw_vertex_layout_format format)
{
    int value_index;
    void *attribute = dst;
    /* if this triggers you tried to provide a color format for a value */
    NK_ASSERT(format < NK_FORMAT_COLOR_BEGIN);
    if (format >= NK_FORMAT_COLOR_BEGIN && format <= NK_FORMAT_COLOR_END) return;
    for (value_index = 0; value_index < value_count; ++value_index) {
        switch (format) {
        default: NK_ASSERT(0 && "invalid vertex layout format"); break;
        case NK_FORMAT_SCHAR: {
            char value = (char)NK_CLAMP(NK_SCHAR_MIN, values[value_index], NK_SCHAR_MAX);
            NK_MEMCPY(attribute, &value, sizeof(value));
            attribute = (void*)((char*)attribute + sizeof(char));
        } break;
        case NK_FORMAT_SSHORT: {
            nk_short value = (nk_short)NK_CLAMP(NK_SSHORT_MIN, values[value_index], NK_SSHORT_MAX);
            NK_MEMCPY(attribute, &value, sizeof(value));
            attribute = (void*)((char*)attribute + sizeof(value));
        } break;
        case NK_FORMAT_SINT: {
            nk_int value = (nk_int)NK_CLAMP(NK_SINT_MIN, values[value_index], NK_SINT_MAX);
            NK_MEMCPY(attribute, &value, sizeof(value));
            attribute = (void*)((char*)attribute + sizeof(nk_int));
        } break;
        case NK_FORMAT_UCHAR: {
            unsigned char value = (unsigned char)NK_CLAMP(NK_UCHAR_MIN, values[value_index], NK_UCHAR_MAX);
            NK_MEMCPY(attribute, &value, sizeof(value));
            attribute = (void*)((char*)attribute + sizeof(unsigned char));
        } break;
        case NK_FORMAT_USHORT: {
            nk_ushort value = (nk_ushort)NK_CLAMP(NK_USHORT_MIN, values[value_index], NK_USHORT_MAX);
            NK_MEMCPY(attribute, &value, sizeof(value));
            attribute = (void*)((char*)attribute + sizeof(value));
            } break;
        case NK_FORMAT_UINT: {
            nk_uint value = (nk_uint)NK_CLAMP(NK_UINT_MIN, values[value_index], NK_UINT_MAX);
            NK_MEMCPY(attribute, &value, sizeof(value));
            attribute = (void*)((char*)attribute + sizeof(nk_uint));
        } break;
        case NK_FORMAT_FLOAT:
            NK_MEMCPY(attribute, &values[value_index], sizeof(values[value_index]));
            attribute = (void*)((char*)attribute + sizeof(float));
            break;
        case NK_FORMAT_DOUBLE: {
            double value = (double)values[value_index];
            NK_MEMCPY(attribute, &value, sizeof(value));
            attribute = (void*)((char*)attribute + sizeof(double));
            } break;
        }
    }
}